

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,std::vector<pstore::repo::linked_definitions::value_type,std::allocator<pstore::repo::linked_definitions::value_type>>*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
          (rule *this,
          vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          *args,back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
                *args_1)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *plVar5;
  ulong uVar6;
  __single_object p;
  _Head_base<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_false>
  local_48;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_40;
  not_null<context_*> local_38;
  
  plVar5 = (linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
            *)operator_new(0x28);
  pcVar2 = (this->context_).ptr_;
  local_40._M_head_impl = (rule *)args;
  gsl::
  not_null<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_*>
  ::ensure_invariant((not_null<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_*>
                      *)&local_40);
  local_38.ptr_ = (context *)args_1;
  gsl::
  not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
  ::ensure_invariant((not_null<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>
                      *)&local_38);
  (plVar5->super_rule).context_.ptr_ = pcVar2;
  (plVar5->super_rule)._vptr_rule = (_func_int **)&PTR__rule_0015c898;
  (plVar5->ld_).ptr_ =
       (vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
        *)local_40._M_head_impl;
  (plVar5->out_).ptr_ =
       (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
        *)local_38.ptr_;
  (plVar5->links_out_).container =
       (vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
        *)local_40._M_head_impl;
  local_48._M_head_impl = plVar5;
  log_top(this,false);
  pcVar2 = (this->context_).ptr_;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&(pcVar2->stack).c);
  local_40._M_head_impl = &(local_48._M_head_impl)->super_rule;
  local_48._M_head_impl =
       (linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
        *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_40);
    if ((linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
         *)local_40._M_head_impl !=
        (linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
         *)0x0) {
      (*((rule *)&(local_40._M_head_impl)->_vptr_rule)->_vptr_rule[1])();
    }
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_40._M_head_impl;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  std::
  unique_ptr<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
                 *)&local_48);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }